

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

void __thiscall VPPOperator::~VPPOperator(VPPOperator *this)

{
  VPPOperator *this_local;
  
  (this->super_BaseNode)._vptr_BaseNode = (_func_int **)&PTR__VPPOperator_001fc8f0;
  std::__cxx11::string::~string((string *)&this->command);
  BaseNode::~BaseNode(&this->super_BaseNode);
  return;
}

Assistant:

explicit VPPOperator() : BaseNode("vpp operator") { }